

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O0

void __thiscall dlib::text_box::set_size(text_box *this,unsigned_long width,unsigned_long height)

{
  scrollable_region *in_RDI;
  auto_mutex M;
  unsigned_long in_stack_00000460;
  unsigned_long in_stack_00000468;
  scrollable_region *in_stack_00000470;
  rmutex *in_stack_ffffffffffffffa8;
  auto_mutex *in_stack_ffffffffffffffb0;
  rectangle *in_stack_ffffffffffffffc8;
  popup_menu_region *in_stack_ffffffffffffffd0;
  
  auto_mutex::auto_mutex(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  scrollable_region::set_size(in_stack_00000470,in_stack_00000468,in_stack_00000460);
  scrollable_region::display_rect(in_RDI);
  popup_menu_region::set_rect(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  auto_mutex::~auto_mutex((auto_mutex *)0x443349);
  return;
}

Assistant:

void text_box::
    set_size (
        unsigned long width,
        unsigned long height 
    )
    {        
        auto_mutex M(m);
        scrollable_region::set_size(width,height);
        right_click_menu.set_rect(display_rect());
    }